

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O3

void __thiscall TestClass2::TestClass2(TestClass2 *this)

{
  double *pdVar1;
  
  (this->m_Str)._M_dataplus._M_p = (pointer)&(this->m_Str).field_2;
  (this->m_Str)._M_string_length = 0;
  (this->m_Str).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x1040cd);
  this->m_Num = 1000;
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = 1.2345;
  this->m_DoublePtr = pdVar1;
  return;
}

Assistant:

TestClass2() {
        m_Str = "TestClass2";

        m_Num = 1000;
        m_DoublePtr = new double(1.2345);
    }